

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

void __thiscall
HighsSymmetryDetection::switchToNextNode(HighsSymmetryDetection *this,HighsInt backtrackDepth)

{
  bool bVar1;
  HighsInt HVar2;
  HighsInt targetCell_00;
  int iVar3;
  size_type sVar4;
  HighsSymmetryDetection *this_00;
  int *piVar5;
  int in_ESI;
  HighsSymmetryDetection *in_RDI;
  HighsInt targetCell;
  Node *currNode;
  HighsInt stackEnd;
  HighsSymmetryDetection *in_stack_000000c8;
  size_type in_stack_ffffffffffffffe8;
  
  sVar4 = std::vector<int,_std::allocator<int>_>::size(&in_RDI->cellCreationStack);
  HVar2 = (HighsInt)sVar4;
  std::vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>::resize
            ((vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_> *)
             CONCAT44(in_ESI,HVar2),in_stack_ffffffffffffffe8);
  if (in_ESI != 0) {
    do {
      this_00 = (HighsSymmetryDetection *)
                std::
                vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                ::back((vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                        *)in_RDI);
      backtrack((HighsSymmetryDetection *)CONCAT44(in_ESI,HVar2),(HighsInt)((ulong)this_00 >> 0x20),
                (HighsInt)this_00);
      HVar2 = *(HighsInt *)&this_00->model;
      sVar4 = std::
              vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>::
              size(&in_RDI->nodeStack);
      targetCell_00 = (HighsInt)sVar4;
      piVar5 = std::min<int>((int *)&stack0xffffffffffffffe4,&in_RDI->firstPathDepth);
      in_RDI->firstPathDepth = *piVar5;
      sVar4 = std::
              vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>::
              size(&in_RDI->nodeStack);
      iVar3 = (int)sVar4;
      piVar5 = std::min<int>((int *)&stack0xffffffffffffffe0,&in_RDI->bestPathDepth);
      in_RDI->bestPathDepth = *piVar5;
      piVar5 = std::min<int>((HighsInt *)((long)&this_00->model + 4),&in_RDI->firstLeavePrefixLen);
      in_RDI->firstLeavePrefixLen = *piVar5;
      piVar5 = std::min<int>((HighsInt *)((long)&this_00->model + 4),&in_RDI->bestLeavePrefixLen);
      in_RDI->bestLeavePrefixLen = *piVar5;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(in_ESI,HVar2),
                 (size_type)this_00);
      bVar1 = determineNextToDistinguish(in_stack_000000c8);
      if (bVar1) {
        cleanupBacktrack((HighsSymmetryDetection *)CONCAT44(in_ESI,HVar2),
                         (HighsInt)((ulong)this_00 >> 0x20));
        bVar1 = distinguishVertex(this_00,targetCell_00);
        if (bVar1) {
          bVar1 = partitionRefinement(in_stack_000000c8);
          if (bVar1) {
            createNode(in_RDI);
            return;
          }
          sVar4 = std::vector<int,_std::allocator<int>_>::size(&in_RDI->cellCreationStack);
          HVar2 = (HighsInt)sVar4;
        }
        else {
          std::vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>::
          pop_back((vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                    *)0x6c9df3);
        }
      }
      else {
        std::vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>::
        pop_back((vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                  *)0x6c9db4);
      }
      bVar1 = std::
              vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>::
              empty((vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                     *)CONCAT44(targetCell_00,iVar3));
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  return;
}

Assistant:

void HighsSymmetryDetection::switchToNextNode(HighsInt backtrackDepth) {
  HighsInt stackEnd = cellCreationStack.size();
  // we need to backtrack the datastructures
  nodeStack.resize(backtrackDepth);
  if (backtrackDepth == 0) return;
  do {
    Node& currNode = nodeStack.back();
    backtrack(currNode.stackStart, stackEnd);
    stackEnd = currNode.stackStart;
    firstPathDepth = std::min((HighsInt)nodeStack.size(), firstPathDepth);
    bestPathDepth = std::min((HighsInt)nodeStack.size(), bestPathDepth);
    firstLeavePrefixLen =
        std::min(currNode.certificateEnd, firstLeavePrefixLen);
    bestLeavePrefixLen = std::min(currNode.certificateEnd, bestLeavePrefixLen);
    currNodeCertificate.resize(currNode.certificateEnd);
    if (!determineNextToDistinguish()) {
      nodeStack.pop_back();
      continue;
    }

    // call cleanup backtrack with the final stackEnd
    // so that all hashes are up to date and the link arrays do not contain
    // chains anymore
    cleanupBacktrack(stackEnd);
    HighsInt targetCell = currNode.targetCell;

    if (!distinguishVertex(targetCell)) {
      // if distinguishing the next vertex fails, it means that its certificate
      // value is lexicographically larger than that of the best leave
      nodeStack.pop_back();
      continue;
    }

    if (!partitionRefinement()) {
      stackEnd = cellCreationStack.size();
      continue;
    }

    createNode();
    break;
  } while (!nodeStack.empty());
}